

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levinson_durbin_recursion.cc
# Opt level: O2

bool __thiscall
sptk::LevinsonDurbinRecursion::Run
          (LevinsonDurbinRecursion *this,vector<double,_std::allocator<double>_> *autocorrelation,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,bool *is_stable,
          Buffer *buffer)

{
  double *pdVar1;
  pointer pdVar2;
  ulong uVar3;
  bool bVar4;
  double *pdVar5;
  size_type __new_size;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int j;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar4 = false;
  if (((buffer != (Buffer *)0x0) && (is_stable != (bool *)0x0)) &&
     (linear_predictive_coefficients != (vector<double,_std::allocator<double>_> *)0x0)) {
    iVar6 = this->num_order_;
    lVar12 = (long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    __new_size = lVar12 >> 3;
    bVar4 = false;
    if (__new_size == (long)iVar6 + 1U) {
      if ((long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>
                )._M_impl.super__Vector_impl_data._M_start != lVar12) {
        std::vector<double,_std::allocator<double>_>::resize
                  (linear_predictive_coefficients,__new_size);
      }
      pdVar5 = (buffer->c_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(buffer->c_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar5 != lVar12) {
        std::vector<double,_std::allocator<double>_>::resize(&buffer->c_,__new_size);
        pdVar5 = (buffer->c_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      *is_stable = true;
      pdVar1 = (autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      *pdVar2 = 0.0;
      dVar13 = *pdVar1;
      lVar12 = 0;
      bVar4 = false;
      if (dVar13 != 0.0) {
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        lVar7 = 2;
        uVar3 = 1;
        for (uVar8 = uVar3; uVar8 != iVar6 + 1; uVar8 = uVar8 + 1) {
          dVar14 = -pdVar1[uVar8];
          lVar11 = lVar12;
          pdVar9 = pdVar5;
          while( true ) {
            pdVar9 = pdVar9 + 1;
            if (lVar11 == 0) break;
            dVar14 = dVar14 - *pdVar9 * pdVar1[lVar11];
            lVar11 = lVar11 + -1;
          }
          dVar14 = dVar14 / dVar13;
          uVar10 = uVar3;
          lVar11 = lVar12;
          if (1.0 <= ABS(dVar14)) {
            *is_stable = false;
          }
          while (lVar11 != 0) {
            pdVar2[uVar10] = pdVar5[lVar11] * dVar14 + pdVar5[uVar10];
            uVar10 = uVar10 + 1;
            lVar11 = lVar11 + -1;
          }
          pdVar2[uVar8] = dVar14;
          dVar13 = dVar13 * (1.0 - dVar14 * dVar14);
          if (dVar13 == 0.0) {
            return false;
          }
          for (lVar11 = 0; lVar7 != lVar11; lVar11 = lVar11 + 1) {
            pdVar5[lVar11] = pdVar2[lVar11];
          }
          lVar7 = lVar7 + 1;
          lVar12 = lVar12 + 1;
        }
        if (dVar13 < 0.0) {
          dVar13 = sqrt(dVar13);
        }
        else {
          dVar13 = SQRT(dVar13);
        }
        *pdVar2 = dVar13;
        bVar4 = true;
      }
    }
  }
  return bVar4;
}

Assistant:

bool LevinsonDurbinRecursion::Run(
    const std::vector<double>& autocorrelation,
    std::vector<double>* linear_predictive_coefficients, bool* is_stable,
    LevinsonDurbinRecursion::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      autocorrelation.size() != static_cast<std::size_t>(length) ||
      NULL == linear_predictive_coefficients || NULL == is_stable ||
      NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (linear_predictive_coefficients->size() !=
      static_cast<std::size_t>(length)) {
    linear_predictive_coefficients->resize(length);
  }
  if (buffer->c_.size() != static_cast<std::size_t>(length)) {
    buffer->c_.resize(length);
  }

  *is_stable = true;

  const double* r(&(autocorrelation[0]));
  double* a(&((*linear_predictive_coefficients)[0]));
  double* c(&buffer->c_[0]);

  // Set initial condition.
  a[0] = 0.0;
  double e(r[0]);
  if (0.0 == e || std::isnan(e)) {
    return false;
  }

  // Perform Durbin's iterative algorithm.
  for (int i(1); i < length; ++i) {
    double k(-r[i]);
    for (int j(1); j < i; ++j) {
      k -= c[j] * r[i - j];
    }
    k /= e;

    if (1.0 <= std::fabs(k)) {
      *is_stable = false;
    }

    for (int j(1); j < i; ++j) {
      a[j] = c[j] + k * c[i - j];
    }
    a[i] = k;

    e *= 1.0 - k * k;
    if (0.0 == e || std::isnan(e)) {
      return false;
    }

    for (int j(0); j <= i; ++j) {
      c[j] = a[j];
    }
  }

  // Set gain.
  a[0] = std::sqrt(e);

  return true;
}